

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O3

void lysc_unres_dflt_free(ly_ctx *ctx,lysc_unres_dflt *r)

{
  lysp_qname *plVar1;
  long lVar2;
  ulong uVar3;
  
  plVar1 = r->dflts;
  if (r->dflt == (lysp_qname *)0x0) {
    if (plVar1 != (lysp_qname *)0x0) {
      uVar3 = 0xffffffffffffffff;
      lVar2 = 0;
      do {
        uVar3 = uVar3 + 1;
        if (*(ulong *)&plVar1[-1].flags <= uVar3) {
          plVar1 = (lysp_qname *)&plVar1[-1].flags;
          goto LAB_00143d28;
        }
        plVar1 = (lysp_qname *)((long)&plVar1->str + lVar2);
        lVar2 = lVar2 + 0x18;
        lysp_qname_free(ctx,plVar1);
        plVar1 = r->dflts;
      } while (plVar1 != (lysp_qname *)0x0);
    }
  }
  else {
    if (plVar1 != (lysp_qname *)0x0) {
      __assert_fail("!r->dflt || !r->dflts",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                    ,0xd1,
                    "void lysc_unres_dflt_free(const struct ly_ctx *, struct lysc_unres_dflt *)");
    }
    lysp_qname_free(ctx,r->dflt);
    plVar1 = r->dflt;
LAB_00143d28:
    free(plVar1);
  }
  free(r);
  return;
}

Assistant:

static void
lysc_unres_dflt_free(const struct ly_ctx *ctx, struct lysc_unres_dflt *r)
{
    assert(!r->dflt || !r->dflts);
    if (r->dflt) {
        lysp_qname_free((struct ly_ctx *)ctx, r->dflt);
        free(r->dflt);
    } else {
        FREE_ARRAY((struct ly_ctx *)ctx, r->dflts, lysp_qname_free);
    }
    free(r);
}